

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

TypePointer * __thiscall
TypeFactory::getTypePointerNoDepth(TypeFactory *this,int4 s,Datatype *pt,uint4 ws)

{
  int iVar1;
  TypePointer *pTVar2;
  
  if (pt->metatype == TYPE_PTR) {
    iVar1 = *(int *)(pt[1]._vptr_Datatype + 6);
    if (iVar1 == 2) {
      return (TypePointer *)pt;
    }
    if (iVar1 == 8) {
      if (*(int *)(pt[1]._vptr_Datatype + 1) == pt->size) {
        return (TypePointer *)pt;
      }
      pt = getBase(this,pt->size,TYPE_UNKNOWN);
    }
  }
  pTVar2 = getTypePointer(this,s,pt,ws);
  return pTVar2;
}

Assistant:

TypePointer *TypeFactory::getTypePointerNoDepth(int4 s,Datatype *pt,uint4 ws)

{
  if (pt->getMetatype()==TYPE_PTR) {
    Datatype *basetype = ((TypePointer *)pt)->getPtrTo();
    type_metatype meta = basetype->getMetatype();
    // Make sure that at least we return a pointer to something the size of -pt-
    if (meta == TYPE_PTR)
      return (TypePointer *)pt;
    else if (meta == TYPE_UNKNOWN) {
      if (basetype->getSize() == pt->getSize())	// If -pt- is pointer to UNKNOWN of the size of a pointer
	return (TypePointer *)pt; // Just return pt, don't add another pointer
      pt = getBase(pt->getSize(),TYPE_UNKNOWN);	// Otherwise construct pointer to UNKNOWN of size of pointer
    }
  }
  return getTypePointer(s,pt,ws);
}